

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSetContentLength(UpnpClient_Handle Hnd,size_t contentLength)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  int iVar3;
  Handle_Info **ppHVar4;
  undefined1 *puVar5;
  Handle_Info *HInfo;
  Handle_Info *local_28;
  
  ppHVar4 = &local_28;
  local_28 = (Handle_Info *)0x0;
  iVar3 = -0x74;
  uVar2 = 0x1222;
  puVar5 = (undefined1 *)contentLength;
  if (UpnpSdkInit == 1) {
    HandleLock((char *)0x1212,(int)contentLength);
    UVar1 = GetHandleInfo(Hnd,&local_28);
    puVar5 = (undefined1 *)ppHVar4;
    if (UVar1 == HND_DEVICE) {
      iVar3 = -0x1fa;
      if (contentLength < 0x7d01) {
        iVar3 = 0;
        g_maxContentLength = contentLength;
      }
    }
    else {
      iVar3 = -100;
      uVar2 = 0x1218;
    }
  }
  HandleUnlock((char *)(ulong)uVar2,(int)puVar5);
  return iVar3;
}

Assistant:

int UpnpSetContentLength(UpnpClient_Handle Hnd, size_t contentLength)
{
	int errCode = UPNP_E_SUCCESS;
	struct Handle_Info *HInfo = NULL;

	do {
		if (UpnpSdkInit != 1) {
			errCode = UPNP_E_FINISH;
			break;
		}

		HandleLock(__FILE__, __LINE__);

		switch (GetHandleInfo(Hnd, &HInfo)) {
		case HND_DEVICE:
			break;
		default:
			HandleUnlock(__FILE__, __LINE__);
			return UPNP_E_INVALID_HANDLE;
		}
		if (contentLength > MAX_SOAP_CONTENT_LENGTH) {
			errCode = UPNP_E_OUTOF_BOUNDS;
			break;
		}
		g_maxContentLength = contentLength;
	} while (0);

	HandleUnlock(__FILE__, __LINE__);
	return errCode;
}